

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<float> fmt::v10::detail::dragonbox::to_decimal<float>(float x)

{
  decimal_fp<float> dVar1;
  carrier_uint cVar2;
  bool bVar3;
  compute_mul_parity_result cVar4;
  uint uVar5;
  carrier_uint cVar6;
  int iVar7;
  int iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  compute_mul_result cVar12;
  decimal_fp<float> dVar13;
  compute_mul_parity_result y_mul;
  bool divisible_by_small_divisor;
  bool approx_y_parity;
  uint32_t dist;
  compute_mul_parity_result x_mul;
  uint32_t r;
  compute_mul_result z_mul;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta;
  cache_entry_type cache;
  int minus_k;
  bool include_right_endpoint;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  uint br;
  decimal_fp<float> ret_value;
  carrier_uint zi;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_1;
  int minus_k_1;
  decimal_fp<float> ret_value_1;
  uint32_t q;
  uint32_t q_1;
  uint32_t mod_inv_25;
  uint32_t mod_inv_5;
  uint32_t q_2;
  uint32_t q_3;
  uint32_t mod_inv_25_1;
  uint32_t mod_inv_5_1;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  carrier_uint in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  uint local_e8;
  bool local_b4;
  bool bStack_b3;
  bool bStack_a9;
  uint local_a8;
  uint32_t local_a4;
  bool bStack_a0;
  uint64_t local_90;
  int local_84;
  byte local_7e;
  byte local_7d;
  uint local_7c;
  uint local_78;
  undefined4 local_74;
  uint local_70;
  float local_6c;
  decimal_fp<float> local_68;
  uint local_60;
  carrier_uint local_5c;
  uint64_t local_58;
  int local_50;
  int local_4c;
  carrier_uint local_48;
  uint local_44;
  int iStack_40;
  uint32_t local_3c;
  uint32_t local_38;
  undefined4 local_34;
  undefined4 local_30;
  uint local_2c;
  uint32_t *local_28;
  uint32_t local_1c;
  uint32_t local_18;
  undefined4 local_14;
  undefined4 local_10;
  uint local_c;
  decimal_fp<float> *local_8;
  
  uVar5 = bit_cast<unsigned_int,_float,_0>(&local_6c);
  local_74 = 0x7fffff;
  local_78 = uVar5 & 0x7fffff;
  local_70 = uVar5;
  cVar6 = exponent_mask<float>();
  iVar7 = num_significand_bits<float>();
  local_7c = (uVar5 & cVar6) >> ((byte)iVar7 & 0x1f);
  if (local_7c == 0) {
    if (local_78 == 0) {
      dVar13.significand = 0;
      dVar13.exponent = 0;
      return dVar13;
    }
    in_stack_ffffffffffffff10 = num_significand_bits<float>();
    local_7c = 0xffffff82 - in_stack_ffffffffffffff10;
  }
  else {
    iVar7 = exponent_bias<float>();
    iVar8 = num_significand_bits<float>();
    local_7c = local_7c - (iVar7 + iVar8);
    if (local_78 == 0) {
      local_48 = local_7c;
      local_4c = floor_log10_pow2_minus_log10_4_over_3(0);
      cVar2 = local_48;
      local_50 = floor_log2_pow10(0);
      local_50 = cVar2 + local_50;
      local_58 = cache_accessor<float>::get_cached_power(0);
      local_5c = cache_accessor<float>::compute_left_endpoint_for_shorter_interval_case
                           ((cache_entry_type *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff0c);
      local_60 = cache_accessor<float>::compute_right_endpoint_for_shorter_interval_case
                           ((cache_entry_type *)
                            CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                            in_stack_ffffffffffffff0c);
      bVar3 = is_left_endpoint_integer_shorter_interval<float>(local_48);
      if (!bVar3) {
        local_5c = local_5c + 1;
      }
      local_44 = local_60 / 10;
      if (local_44 * 10 < local_5c) {
        local_e8 = cache_accessor<float>::compute_round_up_for_shorter_interval_case
                             ((cache_entry_type *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              in_stack_fffffffffffffefc);
        iStack_40 = local_4c;
        if (((int)local_48 < -0x23) || (-0x23 < (int)local_48)) {
          local_44 = local_e8;
          if (local_e8 < local_5c) {
            local_44 = local_e8 + 1;
          }
        }
        else {
          if ((local_e8 & 1) != 0) {
            local_e8 = local_e8 - 1;
          }
          local_44 = local_e8;
        }
      }
      else {
        iStack_40 = local_4c + 1;
        local_28 = &local_44;
        local_2c = 0;
        if (local_44 == 0) {
          assert_fail((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                      in_stack_fffffffffffffefc,(char *)0x1b6533);
        }
        local_30 = 0xcccccccd;
        local_34 = 0xc28f5c29;
        while( true ) {
          uVar9 = rotr(*local_28 * -0x3d70a3d7,2);
          local_38 = uVar9;
          uVar5 = max_value<unsigned_int>();
          if (uVar5 / 100 < uVar9) break;
          *local_28 = local_38;
          local_2c = local_2c + 2;
        }
        uVar9 = rotr(*local_28 * -0x33333333,1);
        local_3c = uVar9;
        uVar5 = max_value<unsigned_int>();
        if (uVar9 <= uVar5 / 10) {
          *local_28 = local_3c;
          local_2c = local_2c | 1;
        }
        iStack_40 = local_2c + iStack_40;
      }
      dVar1.exponent = iStack_40;
      dVar1.significand = local_44;
      return dVar1;
    }
    in_stack_ffffffffffffff14 = num_significand_bits<float>();
    local_78 = 1 << ((byte)in_stack_ffffffffffffff14 & 0x1f) | local_78;
  }
  local_7e = (local_78 & 1) == 0;
  local_7d = local_7e;
  local_84 = floor_log10_pow2(0);
  local_84 = local_84 + -1;
  local_90 = cache_accessor<float>::get_cached_power(0);
  uVar5 = local_7c;
  iVar7 = floor_log2_pow10(0);
  uVar10 = cache_accessor<float>::compute_delta(&local_90,uVar5 + iVar7);
  cVar12 = cache_accessor<float>::compute_mul
                     (uVar5,(cache_entry_type *)
                            CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_a4 = cVar12.result;
  uVar9 = divide_by_10_to_kappa_plus_1(local_a4);
  local_a8 = local_a4 + uVar9 * -100;
  if (local_a8 < uVar10) {
    if ((local_a8 != 0) ||
       (bStack_a0 = cVar12.is_integer, (bStack_a0 & 1U & (local_7e ^ 0xff) & 1) == 0)) {
LAB_001b68d5:
      local_68.exponent = local_84 + 2;
      local_68.significand = uVar9;
      local_8 = &local_68;
      local_c = 0;
      if (uVar9 != 0) {
        local_10 = 0xcccccccd;
        local_14 = 0xc28f5c29;
        while( true ) {
          uVar9 = rotr(local_8->significand * -0x3d70a3d7,2);
          local_18 = uVar9;
          uVar5 = max_value<unsigned_int>();
          if (uVar5 / 100 < uVar9) break;
          local_8->significand = local_18;
          local_c = local_c + 2;
        }
        uVar9 = rotr(local_8->significand * -0x33333333,1);
        local_1c = uVar9;
        uVar5 = max_value<unsigned_int>();
        if (uVar9 <= uVar5 / 10) {
          local_8->significand = local_1c;
          local_c = local_c | 1;
        }
        local_68.exponent = local_c + local_68.exponent;
        return local_68;
      }
      assert_fail((char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  in_stack_fffffffffffffefc,(char *)0x1b6941);
    }
    uVar9 = uVar9 - 1;
    local_a8 = 100;
  }
  else if (local_a8 <= uVar10) {
    cVar4 = cache_accessor<float>::compute_mul_parity
                      (in_stack_ffffffffffffff10,
                       (cache_entry_type *)CONCAT44(uVar5,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff04);
    bStack_a9 = cVar4.is_integer;
    if (((ushort)cVar4 & 1) != 0 || (bStack_a9 & 1U & local_7d & 1) != 0) goto LAB_001b68d5;
  }
  iVar7 = local_84 + 1;
  uVar11 = (local_a8 - (uVar10 >> 1)) + 5;
  bVar3 = check_divisibility_and_divide_by_pow10<1>
                    ((uint32_t *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_68.exponent = iVar7;
  local_68.significand = uVar11 + uVar9 * 10;
  if (bVar3) {
    cVar4 = cache_accessor<float>::compute_mul_parity
                      (in_stack_ffffffffffffff10,
                       (cache_entry_type *)CONCAT44(uVar5,in_stack_ffffffffffffff08),
                       in_stack_ffffffffffffff04);
    local_b4 = cVar4.parity;
    if ((bool)(local_b4 & 1U) == (((uVar11 ^ 5) & 1) != 0)) {
      bStack_b3 = cVar4.is_integer;
      if ((bStack_b3 & 1U & ((ulong)local_68 & 1) != 0) != 0) {
        local_68.significand = local_68.significand - 1;
      }
    }
    else {
      local_68.significand = local_68.significand - 1;
    }
  }
  return local_68;
}

Assistant:

decimal_fp<T> to_decimal(T x) noexcept {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}